

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

QByteArrayView __thiscall Moc::strippedFileName(Moc *this)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  QByteArrayView QVar7;
  
  pcVar3 = (this->filename).d.ptr;
  uVar2 = (this->filename).d.size;
  pcVar1 = pcVar3 + uVar2;
  pcVar4 = pcVar1;
  if (3 < uVar2) {
    lVar5 = (uVar2 >> 2) + 1;
    pcVar6 = pcVar1;
    do {
      pcVar4 = pcVar6;
      if ((pcVar6[-1] == '/') || (pcVar6[-1] == '\\')) goto LAB_0012b5e0;
      if ((pcVar6[-2] == '/') || (pcVar6[-2] == '\\')) {
        pcVar4 = pcVar6 + -1;
        goto LAB_0012b5e0;
      }
      if ((pcVar6[-3] == '/') || (pcVar6[-3] == '\\')) {
        pcVar4 = pcVar6 + -2;
        goto LAB_0012b5e0;
      }
      if ((pcVar6[-4] == '/') || (pcVar6[-4] == '\\')) {
        pcVar4 = pcVar6 + -3;
        goto LAB_0012b5e0;
      }
      pcVar6 = pcVar6 + -4;
      lVar5 = lVar5 + -1;
      pcVar4 = pcVar1 + -(uVar2 & 0xfffffffffffffffc);
    } while (1 < lVar5);
  }
  lVar5 = (long)pcVar4 - (long)pcVar3;
  if (lVar5 == 1) {
LAB_0012b5cf:
    if ((pcVar4[-1] != '/') && (pcVar4[-1] != '\\')) goto LAB_0012b5f1;
  }
  else if (lVar5 == 2) {
LAB_0012b52e:
    if ((pcVar4[-1] != '/') && (pcVar4[-1] != '\\')) {
      pcVar4 = pcVar4 + -1;
      goto LAB_0012b5cf;
    }
  }
  else {
    if (lVar5 != 3) goto LAB_0012b5f1;
    if ((pcVar4[-1] != '/') && (pcVar4[-1] != '\\')) {
      pcVar4 = pcVar4 + -1;
      goto LAB_0012b52e;
    }
  }
LAB_0012b5e0:
  if (pcVar4 != pcVar3) {
    pcVar3 = pcVar3 + (uVar2 - ((long)pcVar1 - (long)pcVar4));
    uVar2 = (long)pcVar1 - (long)pcVar4;
  }
LAB_0012b5f1:
  QVar7.m_data = pcVar3;
  QVar7.m_size = uVar2;
  return QVar7;
}

Assistant:

const T *data() const noexcept { return ptr; }